

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O3

void dgrminer::map_isolated_nodes
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *results,
               multiset<dgrminer::node_label_changetime,_std::less<dgrminer::node_label_changetime>,_std::allocator<dgrminer::node_label_changetime>_>
               *isolated_nodes_counts,iterator *occurrences_iterator,
               iterator *end_occurrences_iterator,vector<int,_std::allocator<int>_> *tmp)

{
  _Base_ptr p_Var1;
  size_type combination_size;
  vector<int,_std::allocator<int>_> *combination;
  pointer pvVar2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  all_combinations;
  iterator local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  p_Var1 = occurrences_iterator->_M_node;
  if (p_Var1 != end_occurrences_iterator->_M_node) {
    combination_size =
         std::
         _Rb_tree<dgrminer::node_label_changetime,_dgrminer::node_label_changetime,_std::_Identity<dgrminer::node_label_changetime>,_std::less<dgrminer::node_label_changetime>,_std::allocator<dgrminer::node_label_changetime>_>
         ::count(&isolated_nodes_counts->_M_t,(key_type *)(p_Var1 + 1));
    combinations(&local_48,(vector<int,_std::allocator<int>_> *)&p_Var1[1]._M_parent,
                 combination_size);
    for (pvVar2 = local_48.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 != local_48.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pvVar2 = pvVar2 + 1) {
      std::vector<int,std::allocator<int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                ((vector<int,std::allocator<int>> *)tmp,
                 (tmp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      local_50._M_node = (_Base_ptr)std::_Rb_tree_increment(occurrences_iterator->_M_node);
      map_isolated_nodes(results,isolated_nodes_counts,&local_50,end_occurrences_iterator,tmp);
      std::vector<int,_std::allocator<int>_>::resize
                (tmp,((long)(tmp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(tmp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2) -
                     ((long)(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2));
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_48);
    return;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::push_back(results,tmp);
  return;
}

Assistant:

void map_isolated_nodes(
		std::vector<std::vector<int>> &results,
		const std::multiset<node_label_changetime>& isolated_nodes_counts,
		const std::map<node_label_changetime, std::vector<int>>::iterator& occurrences_iterator,
		const std::map<node_label_changetime, std::vector<int>>::iterator& end_occurrences_iterator,
		std::vector<int>& tmp
	) {
	  	//check whether end of mapped node labels was reached and backtrack
	  	if (occurrences_iterator == end_occurrences_iterator) {
			results.push_back(tmp);
			return;
		}

	  	// list all possible combinations of real ids
	  	const std::vector<std::vector<int>> all_combinations = combinations(
	  		occurrences_iterator->second,
			isolated_nodes_counts.count(occurrences_iterator->first)
		);

	  	// move to next item mapped node labels
	  	for (auto const &combination : all_combinations) {
			tmp.insert(tmp.end(), combination.cbegin(), combination.cend());

		  	map_isolated_nodes(
				results,
				isolated_nodes_counts,
				std::next(occurrences_iterator),
				end_occurrences_iterator,
				tmp
			);

			tmp.resize(tmp.size() - combination.size());
		}
	}